

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

void __thiscall Node::OutputGetPutOptions(Node *this,Node *Channel,ostream *os)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_80;
  string local_60;
  string local_40;
  
  while (iVar1 = this->Type, iVar1 == 0x1f5) {
    if (this->Tree[0] != (Node *)0x0) {
      OutputGetPutOptions(this->Tree[0],Channel,os);
    }
    this = this->Tree[1];
    if (this == (Node *)0x0) {
      return;
    }
  }
  if (iVar1 == 0x10b) {
LAB_00112e44:
    Indent_abi_cxx11_(&local_60,this);
    poVar2 = std::operator<<(os,(string *)&local_60);
    GetIPChannel_abi_cxx11_(&local_80,Channel,0);
    poVar2 = std::operator<<(poVar2,(string *)&local_80);
    poVar2 = std::operator<<(poVar2,".SetRecord(");
    Expression_abi_cxx11_(&local_40,this->Tree[0]);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    poVar2 = std::operator<<(poVar2,");");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    if (iVar1 == 0x121) {
      GetIPChannel_abi_cxx11_(&local_60,Channel,0);
      poVar2 = std::operator<<(os,(string *)&local_60);
      poVar2 = std::operator<<(poVar2,".SetCount(");
      Expression_abi_cxx11_(&local_80,this->Tree[0]);
      poVar2 = std::operator<<(poVar2,(string *)&local_80);
      poVar2 = std::operator<<(poVar2,");");
      std::endl<char,std::char_traits<char>>(poVar2);
      goto LAB_0011318a;
    }
    if (iVar1 != 0x159) {
      if (iVar1 != 0x183) {
        if (iVar1 == 0x187) {
          Indent_abi_cxx11_(&local_60,this);
          poVar2 = std::operator<<(os,(string *)&local_60);
          GetIPChannel_abi_cxx11_(&local_80,Channel,0);
          poVar2 = std::operator<<(poVar2,(string *)&local_80);
          poVar2 = std::operator<<(poVar2,".SetRegardless();");
          std::endl<char,std::char_traits<char>>(poVar2);
          goto LAB_0011318a;
        }
        if (iVar1 == 0x191) {
          GetIPChannel_abi_cxx11_(&local_60,Channel,0);
          poVar2 = std::operator<<(os,(string *)&local_60);
          poVar2 = std::operator<<(poVar2,".SetRfaValue(");
          Expression_abi_cxx11_(&local_80,this->Tree[0]);
          poVar2 = std::operator<<(poVar2,(string *)&local_80);
          poVar2 = std::operator<<(poVar2,");");
          std::endl<char,std::char_traits<char>>(poVar2);
          goto LAB_0011318a;
        }
        if (iVar1 != 0x1d5) {
          GetIPChannel_abi_cxx11_(&local_60,Channel,0);
          poVar2 = std::operator<<(os,(string *)&local_60);
          poVar2 = std::operator<<(poVar2,".Goofy(");
          Expression_abi_cxx11_(&local_80,this);
          poVar2 = std::operator<<(poVar2,(string *)&local_80);
          poVar2 = std::operator<<(poVar2,");");
          std::endl<char,std::char_traits<char>>(poVar2);
          goto LAB_0011318a;
        }
      }
      goto LAB_00112e44;
    }
    Indent_abi_cxx11_(&local_60,this);
    poVar2 = std::operator<<(os,(string *)&local_60);
    GetIPChannel_abi_cxx11_(&local_80,Channel,0);
    poVar2 = std::operator<<(poVar2,(string *)&local_80);
    poVar2 = std::operator<<(poVar2,".SetKey(");
    Expression_abi_cxx11_(&local_40,this->Tree[0]);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    poVar2 = std::operator<<(poVar2,");");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    if (this->Tree[1] == (Node *)0x0) {
      return;
    }
    Indent_abi_cxx11_(&local_60,this);
    poVar2 = std::operator<<(os,(string *)&local_60);
    GetIPChannel_abi_cxx11_(&local_80,Channel,0);
    poVar2 = std::operator<<(poVar2,(string *)&local_80);
    std::operator<<(poVar2,".SetKeyMode(");
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    iVar1 = this->Tree[1]->Type;
    if (iVar1 == 0x130) {
      pcVar3 = "Equal";
LAB_001131ba:
      std::operator<<(os,pcVar3);
    }
    else {
      if (iVar1 == 0x147) {
        pcVar3 = "GreaterEqual";
        goto LAB_001131ba;
      }
      if (iVar1 == 0x14d) {
        pcVar3 = "Greater";
        goto LAB_001131ba;
      }
    }
    poVar2 = std::operator<<(os,");");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    Indent_abi_cxx11_(&local_60,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_60);
    GetIPChannel_abi_cxx11_(&local_80,Channel,0);
    poVar2 = std::operator<<(poVar2,(string *)&local_80);
    poVar2 = std::operator<<(poVar2,".SetKeyValue(");
    Expression_abi_cxx11_(&local_40,this->Tree[2]);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    poVar2 = std::operator<<(poVar2,");");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)&local_40);
LAB_0011318a:
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void Node::OutputGetPutOptions(
	Node* Channel,		/**< BASIC channel */
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	switch(Type)
	{
	case BAS_N_LIST:
		if (Tree[0] != 0)
		{
			Tree[0]->OutputGetPutOptions(Channel, os);
		}
		if (Tree[1] != 0)
		{
			Tree[1]->OutputGetPutOptions(Channel, os);
		}
		break;

	case BAS_V_RMSRECORD:
	case BAS_S_RECORD:
	case BAS_S_BLOCK:
		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetRecord(" <<
			Tree[0]->Expression() << ");" << std::endl;
		break;

	case BAS_S_REGARDLESS:
		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetRegardless();" << std::endl;
		break;

	case BAS_S_KEY:
		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetKey(" << Tree[0]->Expression() << ");" <<
			std::endl;
		if (Tree[1] != 0)
		{
			os << Indent() <<
				GetIPChannel(Channel, 0) <<
				".SetKeyMode(";
			switch(Tree[1]->Type)
			{
			case BAS_S_EQ:
				os << "Equal";
				break;
			case BAS_S_GE:
				os << "GreaterEqual";
				break;
			case BAS_S_GT:
				os << "Greater";
				break;

			}
			os << ");" << std::endl <<
				Indent() <<
				GetIPChannel(Channel, 0) <<
				".SetKeyValue(" << Tree[2]->Expression() << ");" << std::endl;
		}
		break;

	case BAS_S_RFA:
		os <<
			GetIPChannel(Channel, 0) <<
			".SetRfaValue(" <<
			Tree[0]->Expression() << ");" << std::endl;
		break;

	case BAS_S_COUNT:
		os <<
			GetIPChannel(Channel, 0) <<
			".SetCount(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;
	default:
		os <<
			GetIPChannel(Channel, 0) <<
			".Goofy(" << Expression() << ");" << std::endl;
	}
}